

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O3

void main_cold_3(void)

{
  fprintf(_stderr,"Error: %s\n\n","Too many `--load\' options!");
  fwrite("Use -h to get a list of supported options\n",0x2a,1,_stderr);
  return;
}

Assistant:

static int parse_cmdline(int argc, char** argv)
{
	#define xerror(msg)\
		fprintf(stderr, "Error: %s\n\n", msg); \
		fprintf(stderr, "Use -h to get a list of supported options\n"); \
		return -1;

	int i, j, recog, num_vs;
	if (argc == 1) {
		/* Default command line options */
		need_output = 1;
		strcpy(raw_data_file, "raw.txt");
		strcpy(out_file, "report.txt");
		need_report = 1;
		verbose_level = 1;
		return 1;
	}
	for (i = 1; i < argc; i++) {
		char *arg = argv[i];
		recog = 0;
		if (!strcmp(arg, "-h") || !strcmp(arg, "--help")) {
			usage();
			return 0;
		}
		if (!strncmp(arg, "--load=", 7)) {
			if (need_input) {
				xerror("Too many `--load' options!");
			}
			if (need_output) {
				xerror("Cannot have both `--load' and `--save' options!");
			}
			if (strlen(arg) <= 7) {
				xerror("--load: bad file specification!");
			}
			need_input = 1;
			strcpy(raw_data_file, arg + 7);
			recog = 1;
		}
		if (!strncmp(arg, "--save=", 7)) {
			if (need_output) {
				xerror("Too many `--save' options!");
			}
			if (need_input) {
				xerror("Cannot have both `--load' and `--save' options!");
			}
			if (strlen(arg) <= 7) {
				xerror("--save: bad file specification!");
			}
			need_output = 1;
			strcpy(raw_data_file, arg + 7);
			recog = 1;
		}
		if (!strncmp(arg, "--outfile=", 10)) {
			if (strlen(arg) <= 10) {
				xerror("--output: bad file specification!");
			}
			strcpy(out_file, arg + 10);
			recog = 1;
		}
		if (!strcmp(arg, "--report") || !strcmp(arg, "--all")) {
			need_report = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--clock")) {
			need_clockreport = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--clock-rdtsc")) {
			need_clockreport = 1;
			need_timed_clockreport = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--quiet")) {
			need_quiet = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--verbose")) {
			verbose_level++;
			recog = 1;
		}
		if (!strcmp(arg, "--version")) {
			need_version = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--cpulist")) {
			need_cpulist = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--sgx")) {
			need_sgx = 1;
			need_identify = 1;
			recog = 1;
		}
		if (!strcmp(arg, "--hypervisor")) {
			need_hypervisor = 1;
			need_identify = 1;
			recog = 1;
		}
		if (arg[0] == '-' && arg[1] == 'v') {
			num_vs = 1;
			while (arg[num_vs] == 'v')
				num_vs++;
			if (arg[num_vs] == '\0') {
				verbose_level += num_vs-1;
				recog = 1;
			}
		}
		for (j = 0; j < sz_match; j++)
			if (!strcmp(arg, matchtable[j].synopsis)) {
				if (num_requests >= MAX_REQUESTS) {
					xerror("Too many requests!");
				}
				requests[num_requests++] = matchtable[j].sw;
				recog = 1;
				break;
			}

		if (!recog) {
			fprintf(stderr, "Unrecognized option: `%s'\n\n", arg);
			fprintf(stderr, "Use -h to get a list of supported options\n");
			return -1;
		}
	}
	return 1;
}